

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_manager.cpp
# Opt level: O2

shared_ptr<duckdb::LogStorage,_true> __thiscall duckdb::LogManager::GetLogStorage(LogManager *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<duckdb::LogStorage,_true> sVar1;
  unique_lock<std::mutex> lck;
  unique_lock<std::mutex> uStack_28;
  
  ::std::unique_lock<std::mutex>::unique_lock(&uStack_28,(mutex_type *)(in_RSI + 0x10));
  ::std::__shared_ptr<duckdb::LogStorage,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<duckdb::LogStorage,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<duckdb::LogStorage,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 0xd8));
  ::std::unique_lock<std::mutex>::~unique_lock(&uStack_28);
  sVar1.internal.super___shared_ptr<duckdb::LogStorage,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar1.internal.super___shared_ptr<duckdb::LogStorage,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<duckdb::LogStorage,_true>)
         sVar1.internal.super___shared_ptr<duckdb::LogStorage,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<LogStorage> LogManager::GetLogStorage() {
	unique_lock<mutex> lck(lock);
	return log_storage;
}